

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O0

void av1_set_entropy_contexts
               (MACROBLOCKD *xd,macroblockd_plane *pd,int plane,BLOCK_SIZE plane_bsize,
               TX_SIZE tx_size,int has_eob,int aoff,int loff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__s;
  void *__s_00;
  BLOCK_SIZE in_CL;
  int in_EDX;
  long in_RSI;
  MACROBLOCKD *in_RDI;
  byte in_R8B;
  uint in_R9D;
  int in_stack_00000008;
  int left_contexts;
  int blocks_high;
  int above_contexts;
  int blocks_wide;
  int txs_high;
  int txs_wide;
  ENTROPY_CONTEXT *l;
  ENTROPY_CONTEXT *a;
  int local_50;
  int local_4c;
  
  __s = (void *)(*(long *)(in_RSI + 0x70) + (long)in_stack_00000008);
  __s_00 = (void *)(*(long *)(in_RSI + 0x78) + (long)left_contexts);
  iVar3 = tx_size_wide_unit[in_R8B];
  iVar1 = tx_size_high_unit[in_R8B];
  if ((in_R9D == 0) || (-1 < in_RDI->mb_to_right_edge)) {
    memset(__s,in_R9D & 0xff,(long)iVar3);
  }
  else {
    iVar2 = max_block_wide(in_RDI,in_CL,in_EDX);
    local_4c = iVar3;
    if (iVar2 - in_stack_00000008 <= iVar3) {
      local_4c = iVar2 - in_stack_00000008;
    }
    memset(__s,in_R9D & 0xff,(long)local_4c);
    memset((void *)((long)__s + (long)local_4c),0,(long)(iVar3 - local_4c));
  }
  if ((in_R9D == 0) || (-1 < in_RDI->mb_to_bottom_edge)) {
    memset(__s_00,in_R9D & 0xff,(long)iVar1);
  }
  else {
    iVar3 = max_block_high(in_RDI,in_CL,in_EDX);
    local_50 = iVar1;
    if (iVar3 - left_contexts <= iVar1) {
      local_50 = iVar3 - left_contexts;
    }
    memset(__s_00,in_R9D & 0xff,(long)local_50);
    memset((void *)((long)__s_00 + (long)local_50),0,(long)(iVar1 - local_50));
  }
  return;
}

Assistant:

void av1_set_entropy_contexts(const MACROBLOCKD *xd,
                              struct macroblockd_plane *pd, int plane,
                              BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                              int has_eob, int aoff, int loff) {
  ENTROPY_CONTEXT *const a = pd->above_entropy_context + aoff;
  ENTROPY_CONTEXT *const l = pd->left_entropy_context + loff;
  const int txs_wide = tx_size_wide_unit[tx_size];
  const int txs_high = tx_size_high_unit[tx_size];

  // above
  if (has_eob && xd->mb_to_right_edge < 0) {
    const int blocks_wide = max_block_wide(xd, plane_bsize, plane);
    const int above_contexts = AOMMIN(txs_wide, blocks_wide - aoff);
    memset(a, has_eob, sizeof(*a) * above_contexts);
    memset(a + above_contexts, 0, sizeof(*a) * (txs_wide - above_contexts));
  } else {
    memset(a, has_eob, sizeof(*a) * txs_wide);
  }

  // left
  if (has_eob && xd->mb_to_bottom_edge < 0) {
    const int blocks_high = max_block_high(xd, plane_bsize, plane);
    const int left_contexts = AOMMIN(txs_high, blocks_high - loff);
    memset(l, has_eob, sizeof(*l) * left_contexts);
    memset(l + left_contexts, 0, sizeof(*l) * (txs_high - left_contexts));
  } else {
    memset(l, has_eob, sizeof(*l) * txs_high);
  }
}